

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

Curl_tree * Curl_splay(timeval i,Curl_tree *t)

{
  long lVar1;
  Curl_tree *pCVar2;
  Curl_tree *pCVar3;
  Curl_tree *pCVar4;
  long lVar5;
  long lVar6;
  Curl_tree *pCVar7;
  Curl_tree N;
  
  lVar5 = i.tv_usec;
  lVar6 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    return (Curl_tree *)0x0;
  }
  pCVar7 = &N;
  N.smaller = (Curl_tree *)0x0;
  N.larger = (Curl_tree *)0x0;
  pCVar4 = pCVar7;
  do {
    lVar1 = (t->key).tv_sec;
    if (lVar6 < lVar1) {
LAB_0012dd7d:
      pCVar2 = t->smaller;
      if (pCVar2 == (Curl_tree *)0x0) goto LAB_0012ddfe;
      lVar1 = (pCVar2->key).tv_sec;
      if ((lVar6 < lVar1) || ((lVar6 <= lVar1 && (lVar5 < (pCVar2->key).tv_usec)))) {
        t->smaller = pCVar2->larger;
        pCVar2->larger = t;
        t = pCVar2;
        if (pCVar2->smaller == (Curl_tree *)0x0) goto LAB_0012ddfe;
      }
      pCVar7->smaller = t;
      pCVar3 = pCVar4;
      pCVar7 = t;
    }
    else {
      if (lVar6 <= lVar1) {
        lVar1 = (t->key).tv_usec;
        if (lVar5 < lVar1) goto LAB_0012dd7d;
        if (lVar5 <= lVar1) {
LAB_0012ddfe:
          pCVar4->larger = t->smaller;
          pCVar7->smaller = t->larger;
          t->smaller = N.larger;
          t->larger = N.smaller;
          return t;
        }
      }
      pCVar2 = t->larger;
      if (pCVar2 == (Curl_tree *)0x0) goto LAB_0012ddfe;
      lVar1 = (pCVar2->key).tv_sec;
      pCVar3 = t;
      if ((lVar1 <= lVar6) && ((lVar1 < lVar6 || ((pCVar2->key).tv_usec < lVar5)))) {
        t->larger = pCVar2->smaller;
        pCVar2->smaller = t;
        pCVar3 = pCVar2;
        t = pCVar2;
        if (pCVar2->larger == (Curl_tree *)0x0) goto LAB_0012ddfe;
      }
      pCVar4->larger = pCVar3;
      t = (Curl_tree *)&pCVar3->larger;
    }
    t = t->smaller;
    pCVar4 = pCVar3;
  } while( true );
}

Assistant:

struct Curl_tree *Curl_splay(struct timeval i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;
  long comp;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}